

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
google::protobuf::Reflection::VerifyFieldType<int>(Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  Nonnull<const_char_*> pcVar3;
  bool v1;
  char *pcVar4;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  LogMessage local_80;
  string local_70;
  size_t local_50;
  char *local_48;
  ulong local_40;
  char *local_38;
  ulong *local_30;
  code *local_28;
  size_t *local_20;
  code *local_18;
  
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == v1) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (true,false,"field->is_repeated() == internal::IsRepeatedT<T>");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      pcVar3 = (Nonnull<const_char_*>)0x0;
      if (((long)iVar2 != 1) && (iVar2 != 8)) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar2,1,"+cpp_type == +internal::GetCppType<T>()");
      }
      if (pcVar3 == (Nonnull<const_char_*>)0x0) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x6bf,pcVar3);
      local_38 = (field->all_names_).payload_;
      local_40 = (ulong)*(ushort *)(local_38 + 2);
      local_38 = local_38 + ~local_40;
      pcVar4 = _put + (*_put == '*');
      local_50 = strlen(pcVar4);
      local_20 = &local_50;
      local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      local_18 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      format_00.size_ = (size_t)&local_30;
      format_00.data_ = &DAT_0000001e;
      args_00.len_ = in_R9;
      args_00.ptr_ = (pointer)0x2;
      local_48 = pcVar4;
      local_30 = &local_40;
      absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                (&local_70,(str_format_internal *)"Invalid cast of %s to type %s.",format_00,args_00
                );
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_80,&local_70);
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x6b3,pcVar3);
      local_38 = (field->all_names_).payload_;
      local_40 = (ulong)*(ushort *)(local_38 + 2);
      local_38 = local_38 + ~local_40;
      pcVar4 = _put + (*_put == '*');
      local_50 = strlen(pcVar4);
      local_20 = &local_50;
      local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      local_18 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
      format.size_ = (size_t)&local_30;
      format.data_ = &DAT_0000001e;
      args.len_ = in_R9;
      args.ptr_ = (pointer)0x2;
      local_48 = pcVar4;
      local_30 = &local_40;
      absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                (&local_70,(str_format_internal *)"Invalid cast of %s to type %s.",format,args);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_80,&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    VerifyFieldType<int>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}